

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void SplitUVRow_C(uint8_t *src_uv,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)width + -1;
  for (lVar2 = 0; lVar2 < lVar1; lVar2 = lVar2 + 2) {
    dst_u[lVar2] = src_uv[lVar2 * 2];
    dst_u[lVar2 + 1] = src_uv[lVar2 * 2 + 2];
    dst_v[lVar2] = src_uv[lVar2 * 2 + 1];
    dst_v[lVar2 + 1] = src_uv[lVar2 * 2 + 3];
  }
  if ((width & 1U) != 0) {
    dst_u[lVar1] = src_uv[lVar2 * 2];
    dst_v[lVar1] = src_uv[lVar2 * 2 + 1];
  }
  return;
}

Assistant:

void SplitUVRow_C(const uint8_t* src_uv,
                  uint8_t* dst_u,
                  uint8_t* dst_v,
                  int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_u[x] = src_uv[0];
    dst_u[x + 1] = src_uv[2];
    dst_v[x] = src_uv[1];
    dst_v[x + 1] = src_uv[3];
    src_uv += 4;
  }
  if (width & 1) {
    dst_u[width - 1] = src_uv[0];
    dst_v[width - 1] = src_uv[1];
  }
}